

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFAcroFormDocumentHelper::fixCopiedAnnotations
          (QPDFAcroFormDocumentHelper *this,QPDFObjectHandle *to_page,QPDFObjectHandle *from_page,
          QPDFAcroFormDocumentHelper *from_afdh,
          set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *added_fields)

{
  pointer pQVar1;
  bool bVar2;
  int iVar3;
  QPDFObjectHandle *f;
  pointer this_00;
  allocator<char> local_109;
  QPDFObjectHandle old_annots;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_fields;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_annots;
  QPDFObjectHandle local_c0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_b0;
  QPDFMatrix local_a0;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_70;
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> old_fields;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&old_fields,"/Annots",(allocator<char> *)&local_a0);
  QPDFObjectHandle::getKey(&old_annots,(string *)from_page);
  std::__cxx11::string::~string((string *)&old_fields);
  bVar2 = QPDFObjectHandle::isArray(&old_annots);
  if (bVar2) {
    iVar3 = QPDFObjectHandle::getArrayNItems(&old_annots);
    if (iVar3 != 0) {
      new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &old_fields._M_t._M_impl.super__Rb_tree_header._M_header;
      old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_b0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&old_annots);
      QPDFMatrix::QPDFMatrix(&local_a0);
      transformAnnotations
                (this,(QPDFObjectHandle *)&local_b0,&new_annots,&new_fields,&old_fields,&local_a0,
                 (from_afdh->super_QPDFDocumentHelper).qpdf,from_afdh);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"/Annots",&local_109);
      QPDFObjectHandle::newArray(&local_c0,&new_annots);
      QPDFObjectHandle::replaceKey(to_page,(string *)&local_a0,&local_c0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_c0.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&local_a0);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
                (&local_70,&new_fields);
      addAndRenameFormFields(this,&local_70);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_70);
      pQVar1 = new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (added_fields != (set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)0x0
         ) {
        for (this_00 = new_fields.
                       super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                       _M_impl.super__Vector_impl_data._M_start; this_00 != pQVar1;
            this_00 = this_00 + 1) {
          local_a0.a = (double)QPDFObjectHandle::getObjGen(this_00);
          std::
          _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
          ::_M_insert_unique<QPDFObjGen>(&added_fields->_M_t,(QPDFObjGen *)&local_a0);
        }
      }
      std::
      _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
      ::~_Rb_tree(&old_fields._M_t);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&new_fields);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&new_annots);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&old_annots.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::fixCopiedAnnotations(
    QPDFObjectHandle to_page,
    QPDFObjectHandle from_page,
    QPDFAcroFormDocumentHelper& from_afdh,
    std::set<QPDFObjGen>* added_fields)
{
    auto old_annots = from_page.getKey("/Annots");
    if ((!old_annots.isArray()) || (old_annots.getArrayNItems() == 0)) {
        return;
    }

    std::vector<QPDFObjectHandle> new_annots;
    std::vector<QPDFObjectHandle> new_fields;
    std::set<QPDFObjGen> old_fields;
    transformAnnotations(
        old_annots,
        new_annots,
        new_fields,
        old_fields,
        QPDFMatrix(),
        &(from_afdh.getQPDF()),
        &from_afdh);

    to_page.replaceKey("/Annots", QPDFObjectHandle::newArray(new_annots));
    addAndRenameFormFields(new_fields);
    if (added_fields) {
        for (auto const& f: new_fields) {
            added_fields->insert(f.getObjGen());
        }
    }
}